

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WabtInterface.cpp
# Opt level: O1

char16 * Js::NarrowStringToWide(Context *ctx,char *src,size_t *srcSize,charcount_t *dstSize)

{
  char cVar1;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  BOOL BVar5;
  charcount_t cVar6;
  size_t sVar7;
  undefined4 *puVar8;
  char16 *pcVar9;
  ulong uVar10;
  size_t requestedBytes;
  ulong uVar11;
  
  if (srcSize == (size_t *)0x0) {
    sVar7 = strlen(src);
  }
  else {
    sVar7 = *srcSize;
  }
  uVar11 = sVar7 * 2 + 2;
  if (sVar7 <= uVar11) {
    if (sVar7 * 2 == -2) {
      pcVar9 = (char16 *)&DAT_00000008;
    }
    else {
      this = &ctx->allocator->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
      requestedBytes = 0xffffffffffffffff;
      if (-1 < (long)uVar11) {
        requestedBytes = (sVar7 + 1) * 4;
      }
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00da370e;
        *puVar8 = 0;
      }
      if (requestedBytes == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                                    "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
        if (!bVar3) goto LAB_00da370e;
        *puVar8 = 0;
      }
      pcVar9 = (char16 *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal(this,requestedBytes);
      if (pcVar9 == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00da370e;
        *puVar8 = 0;
      }
    }
    if (pcVar9 != (char16 *)0x0) {
      if (sVar7 < 0xffffffff) {
        uVar11 = 0;
        if (sVar7 != 0) {
          do {
            cVar1 = src[uVar11];
            if (cVar1 < '\x01') {
              bVar3 = uVar11 < 3;
              uVar11 = uVar11 - 3;
              if (bVar3) {
                uVar11 = 0;
              }
            }
            else {
              pcVar9[uVar11] = (short)cVar1;
            }
          } while (('\0' < cVar1) && (uVar11 = uVar11 + 1, uVar11 < sVar7));
        }
        if (sVar7 - uVar11 == 0) {
          pcVar9[sVar7] = L'\0';
          uVar10 = sVar7;
        }
        else {
          bVar3 = false;
          cVar6 = utf8::ByteIndexIntoCharacterIndex
                            ((LPCUTF8)(src + uVar11),sVar7 - uVar11,doDefault);
          uVar10 = (ulong)(cVar6 + (int)uVar11);
          if (sVar7 < uVar10) goto LAB_00da35ec;
          utf8::DecodeUnitsIntoAndNullTerminateNoAdvance
                    (pcVar9 + uVar11,(LPCUTF8)(src + uVar11),(LPCUTF8)(src + sVar7),
                     doAllowInvalidWCHARs,(bool *)0x0);
        }
        bVar3 = true;
        sVar7 = uVar10;
        if (pcVar9[uVar10 & 0xffffffff] != L'\0') {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Codex/Utf8Helper.h"
                                      ,0xaa,"(destString[*destCount] == 0)",
                                      "destString[*destCount] == 0");
          if (!bVar4) {
LAB_00da370e:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar8 = 0;
        }
      }
      else {
        *pcVar9 = L'\0';
        bVar3 = false;
      }
      goto LAB_00da35ec;
    }
  }
  pcVar9 = (char16 *)0x0;
  bVar3 = false;
LAB_00da35ec:
  if (!bVar3) {
    JavascriptError::ThrowOutOfMemoryError(ctx->scriptContext);
  }
  if (dstSize != (charcount_t *)0x0) {
    *dstSize = (charcount_t)sVar7;
  }
  return pcVar9;
}

Assistant:

char16* NarrowStringToWide(Context* ctx, const char* src, const size_t* srcSize = nullptr, charcount_t* dstSize = nullptr)
{
    auto allocator = [&ctx](size_t size) {return (char16*)AnewArray(ctx->allocator, char16, size); };
    char16* dst = nullptr;
    charcount_t size;
    HRESULT hr = utf8::NarrowStringToWide(allocator, src, srcSize ? *srcSize : strlen(src), &dst, &size);
    if (hr != S_OK)
    {
        JavascriptError::ThrowOutOfMemoryError(ctx->scriptContext);
    }
    if (dstSize)
    {
        *dstSize = size;
    }
    return dst;
}